

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O2

void __thiscall
Clasp::BasicProgramAdapter::rule
          (BasicProgramAdapter *this,Head_t param_1,AtomSpan *head,Weight_t bound,
          WeightLitSpan *body)

{
  WeightLitVec *lits;
  BasicProgramAdapter *pBVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  WeightLit_t *pWVar5;
  long lVar6;
  pair<Clasp::Literal,_int> local_40;
  BasicProgramAdapter *local_38;
  
  if (head->size == 0) {
    (this->constraint_).ebo_.size = 0;
    lits = &this->constraint_;
    pWVar5 = body->first;
    iVar4 = 0;
    local_38 = this;
    for (lVar6 = body->size << 3; pBVar1 = local_38, lVar6 != 0; lVar6 = lVar6 + -8) {
      iVar2 = pWVar5->lit;
      uVar3 = iVar2 * -4 + 2;
      if (-1 < iVar2) {
        uVar3 = iVar2 * 4;
      }
      local_40.first.rep_ = uVar3 ^ 2;
      local_40.second = pWVar5->weight;
      bk_lib::
      pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
      push_back(lits,&local_40);
      iVar4 = iVar4 + pWVar5->weight;
      pWVar5 = pWVar5 + 1;
    }
    iVar2 = (*local_38->prg_->_vptr_ProgramBuilder[8])();
    iVar4 = (iVar4 - bound) + 1;
    if (iVar2 == 0) {
      SatBuilder::addConstraint((SatBuilder *)pBVar1->prg_,lits,iVar4);
    }
    else {
      PBBuilder::addConstraint((PBBuilder *)pBVar1->prg_,lits,iVar4,false,0);
    }
    return;
  }
  Potassco::fail(-2,
                 "virtual void Clasp::BasicProgramAdapter::rule(Potassco::Head_t, const Potassco::AtomSpan &, Potassco::Weight_t, const Potassco::WeightLitSpan &)"
                 ,0x17d,"empty(head)","unsupported rule type",0);
}

Assistant:

void BasicProgramAdapter::rule(Potassco::Head_t, const Potassco::AtomSpan& head, Potassco::Weight_t bound, const Potassco::WeightLitSpan& body) {
	using namespace Potassco;
	POTASSCO_REQUIRE(empty(head), "unsupported rule type");
	constraint_.clear();
	Potassco::Weight_t sum = 0;
	for (WeightLitSpan::iterator it = begin(body), end = Potassco::end(body); it != end; ++it) {
		constraint_.push_back(WeightLiteral(~toLit(it->lit), it->weight));
		sum += it->weight;
	}
	if (prg_->type() == Problem_t::Sat) {
		static_cast<SatBuilder&>(*prg_).addConstraint(constraint_, (sum - bound) + 1);
	}
	else {
		static_cast<PBBuilder&>(*prg_).addConstraint(constraint_, (sum - bound) + 1);
	}
}